

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlannerForDecPOMDPDiscrete.h
# Opt level: O0

void __thiscall
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
          (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *this,
          shared_ptr<PartialPolicyPoolItemInterface> *ppi,
          shared_ptr<BayesianGameIdenticalPayoffSolver> *bgips)

{
  type pPVar1;
  type this_00;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  PlanningUnit *in_RDI;
  bool is_last_ts;
  size_t ts;
  PJPDP_sharedPtr jpolPrevTs;
  double in_stack_000000e0;
  bool in_stack_000000ef;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *in_stack_000000f0;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_000000f8;
  GeneralizedMAAStarPlanner *in_stack_00000100;
  shared_ptr<PartialJointPolicyDiscretePure> local_28 [2];
  
  pPVar1 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(in_RSI);
  (*pPVar1->_vptr_PartialPolicyPoolItemInterface[2])();
  this_00 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(local_28);
  JointPolicy::GetDepth((JointPolicy *)this_00);
  PlanningUnit::GetHorizon(in_RDI);
  PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x967e5f);
  GeneralizedMAAStarPlanner::SetCBGbounds
            (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,
             in_stack_000000e0);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x967e97);
  return;
}

Assistant:

void SetCBGbounds(const boost::shared_ptr<PartialPolicyPoolItemInterface> &ppi,
                          const boost::shared_ptr<BayesianGameIdenticalPayoffSolver> &bgips)
        {
            PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
            size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
            bool is_last_ts = (ts ==  GetHorizon() - 1);
            this->GeneralizedMAAStarPlanner::SetCBGbounds(ppi,bgips,is_last_ts,GetDiscount());
        }